

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void movingDoCommand(char *orientationName,double scoreBias,atom *allMovingAtoms,void *userdata)

{
  undefined8 *puVar1;
  long lVar2;
  atomBins *bbins_00;
  atom *paVar3;
  atomBins *bbins;
  atom *a;
  region nonMovingBB;
  region boundingBoxB;
  movingCommandInfo *m;
  void *userdata_local;
  atom *allMovingAtoms_local;
  double scoreBias_local;
  char *orientationName_local;
  
  if (allMovingAtoms != (atom *)0x0) {
    nonMovingBB.max.z = (allMovingAtoms->loc).x;
    for (bbins = (atomBins *)allMovingAtoms; bbins != (atomBins *)0x0;
        bbins = (atomBins *)(bbins->min).x) {
      updateBoundingBox((point3d *)&(bbins->sz).y,(region *)&nonMovingBB.max.z);
    }
    puVar1 = *(undefined8 **)((long)userdata + 0x28);
    a = (atom *)*puVar1;
    nonMovingBB.min.x = (double)puVar1[1];
    nonMovingBB.min.y = (double)puVar1[2];
    lVar2 = *(long *)((long)userdata + 0x28);
    nonMovingBB.min.z = *(double *)(lVar2 + 0x18);
    nonMovingBB.max.x = *(double *)(lVar2 + 0x20);
    nonMovingBB.max.y = *(double *)(lVar2 + 0x28);
    addBBox2BBox((region *)&a,(region *)&nonMovingBB.max.z);
    bbins_00 = binAtoms(allMovingAtoms,(region *)&nonMovingBB.max.z,'b',
                        *(float *)((long)userdata + 0x38),*(int *)((long)userdata + 4),3);
    if ((*(long *)((long)userdata + 0x28) == 0) || (bbins_00 == (atomBins *)0x0)) {
      halt("no atoms for autobondrot processing");
    }
    if (ImplicitH == 0) {
      if (*userdata == 0) {
        for (bbins = *(atomBins **)((long)userdata + 0x20); paVar3 = allMovingAtoms,
            bbins != (atomBins *)0x0; bbins = (atomBins *)(bbins->min).x) {
          if ((((ulong)(bbins->max).z & 0x10000000) != 0) &&
             (*(int *)((long)&(bbins->max).z + 4) == 9)) {
            *(uint *)&(bbins->max).z = *(uint *)&(bbins->max).z | 0x10000;
          }
        }
        while (bbins = (atomBins *)paVar3, bbins != (atomBins *)0x0) {
          if ((((ulong)(bbins->max).z & 0x10000000) != 0) &&
             (*(int *)((long)&(bbins->max).z + 4) == 9)) {
            *(uint *)&(bbins->max).z = *(uint *)&(bbins->max).z | 0x10000;
          }
          paVar3 = (atom *)(bbins->min).x;
        }
        updateHydrogenInfo(*(FILE **)((long)userdata + 8),*(atom **)((long)userdata + 0x20),
                           *(atomBins **)((long)userdata + 0x28),allMovingAtoms,bbins_00,3,0);
      }
      else {
        paVar3 = updateHydrogenInfo(*(FILE **)((long)userdata + 8),*(atom **)((long)userdata + 0x18)
                                    ,*(atomBins **)((long)userdata + 0x28),allMovingAtoms,bbins_00,3
                                    ,1);
        *(atom **)((long)userdata + 0x20) = paVar3;
        *(undefined4 *)userdata = 0;
      }
    }
    doCommand(*(FILE **)((long)userdata + 8),*(int *)((long)userdata + 0x10),
              *(atom **)((long)userdata + 0x18),*(atomBins **)((long)userdata + 0x28),allMovingAtoms
              ,bbins_00,*(pointSet **)((long)userdata + 0x30),*(float *)((long)userdata + 0x38),
              *(float *)((long)userdata + 0x3c),*(float *)((long)userdata + 0x40),
              *(int *)((long)userdata + 0x44),*(int *)((long)userdata + 0x48),0,orientationName,
              scoreBias,*(int *)((long)userdata + 0x4c),*(int *)((long)userdata + 0x50),
              *(char **)((long)userdata + 0x58),*(int *)((long)userdata + 0x60),
              *(char ***)((long)userdata + 0x68),*(char **)((long)userdata + 0x70));
    disposeBins(bbins_00);
  }
  return;
}

Assistant:

void movingDoCommand(char* orientationName, double scoreBias,
		  atom *allMovingAtoms, void *userdata)
{/*movingDoCommand() for autobondrot*/
   /*orientationName holds the angle values as a character string*/

/* NOTE: allMainAtoms/abins & allMovingAtoms/bbins must be disjoint */
/*       sets of atoms (none in common) or allMovingAtoms/bbins can */
/*       be NULL.                                                   */
/*       allMovingAtoms refers to autobondrot set of atoms          */

   movingCommandInfo *m = (movingCommandInfo *)userdata;
   region boundingBoxB, nonMovingBB;
   atom *a = NULL;
   atomBins *bbins = NULL;

   /*autobondrot.c: alst == atom *allMovingAtoms existance implies autobondrot*/
   if (allMovingAtoms) {
      boundingBoxB.min = allMovingAtoms->loc;
      boundingBoxB.max = allMovingAtoms->loc;
      for(a = allMovingAtoms; a; a = a->next) {
	 updateBoundingBox(&(a->loc), &boundingBoxB);
      }

      /* Expand bounding box because of extra water hydrogens */
      /*                        added in updateHydrogenInfo() */
      nonMovingBB.min = m->abins->min;
      nonMovingBB.max = m->abins->max;
      addBBox2BBox(&nonMovingBB, &boundingBoxB);

      bbins = binAtoms(allMovingAtoms, &boundingBoxB, 'b', m->probeRad,
			m->keepUnselected, SET1|SET2);

      if (m->abins == NULL || bbins == NULL) {
	 halt("no atoms for autobondrot processing");
      }

      if (! ImplicitH) {
	 if (m->firstPass) {
	    m->waterClones = updateHydrogenInfo(m->outf, m->allMainAtoms,
                             m->abins, allMovingAtoms, bbins, SET1|SET2, TRUE);
	    m->firstPass = FALSE;
	 }
	 else {
	    /*the DONOR prop tells updateHydrogenInfo() to build H? atoms*/
	    for(a = m->waterClones; a; a = a->next) {
	       if ((a->props & AMBIGWATER_PROP) && (a->elem == atomO)) {
		  a->props |= DONOR_PROP; /* turn water donor property back on*/
	       }
	    } /* since each pass through updateHydrogenInfo turns it off */

	    for(a = allMovingAtoms; a; a = a->next) {
	       if ((a->props & AMBIGWATER_PROP) && (a->elem == atomO)) {
		  a->props |= DONOR_PROP; /* turn water donor property back on*/
	       }
	    } /* since each pass through updateHydrogenInfo turns it off */

	    updateHydrogenInfo(m->outf, m->waterClones, m->abins,
	       allMovingAtoms, bbins, SET1|SET2, FALSE);
	 }
      }

      /*autobondrot at this stage has m->method == INTERSECTONCE == 1 */
      /* or m->method == SELFINTERSECT == 3 (seems as given in probe command)*/
      /* and m->countDots==1, m->rawOutput==1, m->drawSpike==1 */
      /* orientationName==rawname== char* holding angle values */

      doCommand(m->outf, m->method,
	 m->allMainAtoms, m->abins,
	 allMovingAtoms, bbins,
	 m->dots, m->probeRad, m->density, m->spikelen,
	 m->countDots, m->rawOutput, FALSE, orientationName, scoreBias,
	 m->drawSpike, m->sayGroup, m->groupLabel,
	 m->argc, m->argv, m->message); // SJ -10/07/2011 by default no condensed output for this

         /*allMovingAtoms is closest thing to a flag for autobondrot mode*/

      disposeBins(bbins);
   }
}